

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naviebayes.cpp
# Opt level: O1

void __thiscall NavieBayes::bayesEstim(NavieBayes *this,double *lmbda)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  pointer pdVar3;
  mapped_type_conflict *pmVar4;
  pointer pvVar5;
  _Rb_tree_node_base *p_Var6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  pointer pdVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  cond;
  ulong local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  key_type local_b0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *local_70;
  long local_68;
  long local_60;
  double local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pdVar10 = (this->super_Base).trainDataGT.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pdVar3 = (this->super_Base).trainDataGT.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pdVar10 != pdVar3) {
    do {
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_b0.first,vsnprintf,0x148,"%f",*pdVar10);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::operator[](&this->priProb,&local_b0.first);
      *pmVar4 = *pmVar4 + 1.0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.first._M_dataplus._M_p != &local_b0.first.field_2) {
        operator_delete(local_b0.first._M_dataplus._M_p);
      }
      pdVar10 = pdVar10 + 1;
    } while (pdVar10 != pdVar3);
  }
  if ((this->super_Base).indim != 0) {
    local_70 = &this->priProb;
    local_e0 = 0;
    do {
      pvVar5 = (this->super_Base).trainDataF.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->super_Base).trainDataF.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pvVar5) {
        local_60 = local_e0 * 3;
        local_68 = local_e0 * 0x30;
        lVar11 = 0;
        uVar9 = 0;
        do {
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_d0,vsnprintf,0x148,"%f",
                     *(undefined8 *)
                      (*(long *)((long)&(pvVar5->super__Vector_base<double,_std::allocator<double>_>
                                        )._M_impl.super__Vector_impl_data._M_start + lVar11) +
                      local_e0 * 8));
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_50,vsnprintf,0x148,"%f",
                     (this->super_Base).trainDataGT.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9]);
          local_b0.first._M_dataplus._M_p = (pointer)&local_b0.first.field_2;
          paVar1 = &local_d0.field_2;
          local_b0.second._M_dataplus._M_p = (pointer)&local_b0.second.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p == paVar1) {
            local_b0.first.field_2._8_8_ = local_d0.field_2._8_8_;
          }
          else {
            local_b0.first._M_dataplus._M_p = local_d0._M_dataplus._M_p;
          }
          local_b0.first.field_2._M_allocated_capacity._1_7_ =
               local_d0.field_2._M_allocated_capacity._1_7_;
          local_b0.first.field_2._M_local_buf[0] = local_d0.field_2._M_local_buf[0];
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p == &local_50.field_2) {
            local_b0.second.field_2._8_8_ = local_50.field_2._8_8_;
          }
          else {
            local_b0.second._M_dataplus._M_p = local_50._M_dataplus._M_p;
          }
          local_b0.first._M_string_length = local_d0._M_string_length;
          local_d0.field_2._M_local_buf[0] = '\0';
          local_d0._M_string_length = 0;
          local_d0._M_dataplus._M_p = (pointer)paVar1;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_d0,vsnprintf,0x148,"%f",
                     (this->super_Base).trainDataGT.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9]);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::operator[](local_70,&local_d0);
          local_58 = *pmVar4;
          dVar2 = *lmbda;
          pvVar5 = (this->xVal).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar8 = *(long *)((long)&(pvVar5->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data + local_60 * 8);
          lVar7 = *(long *)((long)&(pvVar5->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data + local_60 * 8 + 8);
          pmVar4 = std::
                   map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>_>
                   ::operator[]((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>_>
                                 *)(*(long *)&this->condProb + local_68),&local_b0);
          lVar7 = lVar7 - lVar8;
          lVar8 = lVar7 >> 3;
          auVar12._8_4_ = (int)(lVar7 >> 0x23);
          auVar12._0_8_ = lVar8;
          auVar12._12_4_ = 0x45300000;
          *pmVar4 = 1.0 / (dVar2 * ((auVar12._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) +
                          local_58) + *pmVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0.second._M_dataplus._M_p != &local_b0.second.field_2) {
            operator_delete(local_b0.second._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0.first._M_dataplus._M_p != &local_b0.first.field_2) {
            operator_delete(local_b0.first._M_dataplus._M_p);
          }
          uVar9 = uVar9 + 1;
          pvVar5 = (this->super_Base).trainDataF.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar11 = lVar11 + 0x18;
        } while (uVar9 < (ulong)(((long)(this->super_Base).trainDataF.
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >>
                                 3) * -0x5555555555555555));
      }
      local_e0 = local_e0 + 1;
    } while (local_e0 < (this->super_Base).indim);
  }
  if ((this->super_Base).indim != 0) {
    uVar9 = 0;
    do {
      lVar11 = *(long *)&this->condProb + uVar9 * 0x30;
      for (p_Var6 = *(_Rb_tree_node_base **)(lVar11 + 0x18);
          p_Var6 != (_Rb_tree_node_base *)(lVar11 + 8);
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        dVar2 = *lmbda;
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::operator[](&this->priProb,(key_type *)(p_Var6 + 2));
        pvVar5 = (this->xVal).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar8 = (long)*(pointer *)
                       ((long)&pvVar5[uVar9].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data + 8) -
                *(long *)&pvVar5[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        lVar7 = lVar8 >> 3;
        auVar13._8_4_ = (int)(lVar8 >> 0x23);
        auVar13._0_8_ = lVar7;
        auVar13._12_4_ = 0x45300000;
        *(double *)(p_Var6 + 3) =
             dVar2 / (((auVar13._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) * *lmbda +
                     *pmVar4) + *(double *)(p_Var6 + 3);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (this->super_Base).indim);
  }
  p_Var6 = *(_Rb_tree_node_base **)&this->field_0x118;
  if (p_Var6 != (_Rb_tree_node_base *)&this->field_0x108) {
    lVar11 = ((long)(this->yVal).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->yVal).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) +
             ((long)(this->super_Base).trainDataF.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->super_Base).trainDataF.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    auVar14._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar14._0_8_ = lVar11;
    auVar14._12_4_ = 0x45300000;
    do {
      *(double *)(p_Var6 + 2) =
           (*(double *)(p_Var6 + 2) + *lmbda) /
           ((auVar14._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0));
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != (_Rb_tree_node_base *)&this->field_0x108);
  }
  return;
}

Assistant:

void NavieBayes::bayesEstim(const double& lmbda = 1.0){
    for(const auto& gt: trainDataGT){
        priProb[std::to_string(gt)] += 1.0;
    }
    for(unsigned long i=0;i<indim;++i){
        for(unsigned long j=0;j<trainDataF.size();++j)
        {
            auto cond = std::make_pair(std::to_string(trainDataF[j][i]), std::to_string(trainDataGT[j]));

            condProb[i][cond] += 1.0/(priProb[std::to_string(trainDataGT[j])]+lmbda*xVal[i].size());
        }
    }
    for(unsigned long i=0;i<indim;++i){
        for(auto& d:condProb[i]){
            d.second += lmbda/(priProb[d.first.second]+lmbda*xVal[i].size());
        }
    }

    for(auto& iter:priProb)
        iter.second = (iter.second+lmbda)/(double(trainDataF.size()+yVal.size()));
}